

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

char * get_D3D_register_string
                 (Context *ctx,RegisterType regtype,int regnum,char *regnum_str,size_t regnum_size)

{
  char *pcVar1;
  char *pcVar2;
  
  if (REG_TYPE_MAX < regtype) {
switchD_00110c75_caseD_b:
    failf(ctx,"%s","unknown register type");
    pcVar2 = "???";
    goto LAB_00110d92;
  }
  switch(regtype) {
  case REG_TYPE_TEMP:
    pcVar1 = "r";
    break;
  case REG_TYPE_INPUT:
    pcVar1 = "v";
    break;
  case REG_TYPE_CONST:
    pcVar1 = "c";
    break;
  case REG_TYPE_ADDRESS:
    pcVar1 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar1 = "a";
    }
    break;
  case REG_TYPE_RASTOUT:
    if ((uint)regnum < 3) {
      pcVar2 = &DAT_00152b64 + *(int *)(&DAT_00152b64 + (ulong)(uint)regnum * 4);
    }
    else {
      pcVar2 = (char *)0x0;
    }
    goto LAB_00110d92;
  case REG_TYPE_ATTROUT:
    pcVar1 = "oD";
    break;
  case REG_TYPE_OUTPUT:
    if ((ctx->shader_type == MOJOSHADER_TYPE_VERTEX) && (2 < ctx->major_ver)) {
      pcVar1 = "o";
    }
    else {
      pcVar1 = "oT";
    }
    break;
  case REG_TYPE_CONSTINT:
    pcVar1 = "i";
    break;
  case REG_TYPE_COLOROUT:
    pcVar1 = "oC";
    break;
  case REG_TYPE_DEPTHOUT:
    pcVar2 = "oDepth";
    goto LAB_00110d92;
  case REG_TYPE_SAMPLER:
    pcVar1 = "s";
    break;
  default:
    goto switchD_00110c75_caseD_b;
  case REG_TYPE_CONSTBOOL:
    pcVar1 = "b";
    break;
  case REG_TYPE_LOOP:
    pcVar2 = "aL";
    goto LAB_00110d92;
  case REG_TYPE_MISCTYPE:
    pcVar1 = (char *)0x0;
    if (regnum == 1) {
      pcVar1 = "vFace";
    }
    pcVar2 = "vPos";
    if (regnum != 0) {
      pcVar2 = pcVar1;
    }
LAB_00110d92:
    *regnum_str = '\0';
    return pcVar2;
  case REG_TYPE_LABEL:
    pcVar1 = "l";
    break;
  case REG_TYPE_MAX:
    pcVar1 = "p";
  }
  snprintf(regnum_str,0x10,"%u");
  return pcVar1;
}

Assistant:

static const char *get_D3D_register_string(Context *ctx,
                                           RegisterType regtype,
                                           int regnum, char *regnum_str,
                                           size_t regnum_size)
{
    const char *retval = NULL;
    int has_number = 1;

    switch (regtype)
    {
        case REG_TYPE_TEMP:
            retval = "r";
            break;

        case REG_TYPE_INPUT:
            retval = "v";
            break;

        case REG_TYPE_CONST:
            retval = "c";
            break;

        case REG_TYPE_ADDRESS:  // (or REG_TYPE_TEXTURE, same value.)
            retval = shader_is_vertex(ctx) ? "a" : "t";
            break;

        case REG_TYPE_RASTOUT:
            switch ((RastOutType) regnum)
            {
                case RASTOUT_TYPE_POSITION: retval = "oPos"; break;
                case RASTOUT_TYPE_FOG: retval = "oFog"; break;
                case RASTOUT_TYPE_POINT_SIZE: retval = "oPts"; break;
            } // switch
            has_number = 0;
            break;

        case REG_TYPE_ATTROUT:
            retval = "oD";
            break;

        case REG_TYPE_OUTPUT: // (or REG_TYPE_TEXCRDOUT, same value.)
            if (shader_is_vertex(ctx) && shader_version_atleast(ctx, 3, 0))
                retval = "o";
            else
                retval = "oT";
            break;

        case REG_TYPE_CONSTINT:
            retval = "i";
            break;

        case REG_TYPE_COLOROUT:
            retval = "oC";
            break;

        case REG_TYPE_DEPTHOUT:
            retval = "oDepth";
            has_number = 0;
            break;

        case REG_TYPE_SAMPLER:
            retval = "s";
            break;

        case REG_TYPE_CONSTBOOL:
            retval = "b";
            break;

        case REG_TYPE_LOOP:
            retval = "aL";
            has_number = 0;
            break;

        case REG_TYPE_MISCTYPE:
            switch ((const MiscTypeType) regnum)
            {
                case MISCTYPE_TYPE_POSITION: retval = "vPos"; break;
                case MISCTYPE_TYPE_FACE: retval = "vFace"; break;
            } // switch
            has_number = 0;
            break;

        case REG_TYPE_LABEL:
            retval = "l";
            break;

        case REG_TYPE_PREDICATE:
            retval = "p";
            break;

        //case REG_TYPE_TEMPFLOAT16:  // !!! FIXME: don't know this asm string
        default:
            fail(ctx, "unknown register type");
            retval = "???";
            has_number = 0;
            break;
    } // switch

    if (has_number)
        snprintf(regnum_str, regnum_size, "%u", (uint) regnum);
    else
        regnum_str[0] = '\0';

    return retval;
}